

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long lhs,
         SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  uint uVar2;
  uint in_ESI;
  unsigned_long in_RDI;
  unsigned_long ret;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_long *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  unsigned_long local_10;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  uint local_4;
  
  local_10 = in_RDI;
  local_8.m_int = in_ESI;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_14);
  bVar1 = DivisionCornerCaseHelper<unsigned_int,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_10,local_8,&local_14);
  if (bVar1) {
    local_4 = local_14.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_int,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_10,local_8,&local_14);
    if (bVar1) {
      local_4 = local_14.m_int;
    }
    else {
      uVar2 = SafeInt::operator_cast_to_unsigned_int
                        ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      DivisionHelper<unsigned_long,_unsigned_int,_0>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((unsigned_long *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                 (uint *)in_stack_ffffffffffffffc8,(unsigned_long *)0x1aa168);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_long>
                ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    }
  }
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_4;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}